

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

DoubleToStringConverter * FIX::double_conversion::DoubleToStringConverter::EcmaScriptConverter(void)

{
  int iVar1;
  int flags;
  
  if (EcmaScriptConverter()::converter == '\0') {
    iVar1 = __cxa_guard_acquire(&EcmaScriptConverter()::converter);
    if (iVar1 != 0) {
      DoubleToStringConverter(&EcmaScriptConverter::converter,9,"Infinity","NaN",'e',-6,0x15,6,0);
      __cxa_guard_release(&EcmaScriptConverter()::converter);
    }
  }
  return &EcmaScriptConverter::converter;
}

Assistant:

const DoubleToStringConverter& DoubleToStringConverter::EcmaScriptConverter() {
  int flags = UNIQUE_ZERO | EMIT_POSITIVE_EXPONENT_SIGN;
  static DoubleToStringConverter converter(flags,
                                           "Infinity",
                                           "NaN",
                                           'e',
                                           -6, 21,
                                           6, 0);
  return converter;
}